

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O2

void __thiscall
primecount::Vector<primecount::PhiTiny::sieve_t,_std::allocator<primecount::PhiTiny::sieve_t>_>::
resize(Vector<primecount::PhiTiny::sieve_t,_std::allocator<primecount::PhiTiny::sieve_t>_> *this,
      size_t n)

{
  ulong uVar1;
  sieve_t *psVar2;
  
  psVar2 = this->array_;
  uVar1 = ((long)this->end_ - (long)psVar2) / 0xc;
  if (uVar1 < n) {
    if ((ulong)(((long)this->capacity_ - (long)psVar2) / 0xc) < n) {
      reserve_unchecked(this,n);
      psVar2 = this->array_;
    }
  }
  else if (uVar1 <= n) {
    return;
  }
  this->end_ = psVar2 + n;
  return;
}

Assistant:

void resize(std::size_t n)
  {
    if (n > size())
    {
      if (n > capacity())
        reserve_unchecked(n);

      // This default initializes memory of classes and structs
      // with constructors (and with in-class initialization of
      // non-static members). But it does not default initialize
      // memory for POD types like int, long.
      if (!std::is_trivial<T>::value)
        uninitialized_default_construct(end_, array_ + n);

      end_ = array_ + n;
    }
    else if (n < size())
    {
      destroy(array_ + n, end_);
      end_ = array_ + n;
    }
  }